

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O0

bool Potassco::matchAtomArg(char **input,StringSpan *arg)

{
  bool bVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  bool bVar2;
  Span<char> SVar3;
  bool quoted;
  int p;
  char *scan;
  char *local_38;
  size_t local_30;
  int local_24;
  char *local_20;
  
  local_20 = (char *)*in_RDI;
  local_24 = 0;
  for (; *local_20 != '\0'; local_20 = local_20 + 1) {
    if (*local_20 == '(') {
      local_24 = local_24 + 1;
    }
    else if (*local_20 == ')') {
      local_24 = local_24 + -1;
      if (local_24 < 0) break;
    }
    else if (*local_20 == ',') {
      if (local_24 == 0) break;
    }
    else if (*local_20 == '\"') {
      bVar2 = false;
      while( true ) {
        local_20 = local_20 + 1;
        bVar1 = false;
        if ((*local_20 != '\0') && (bVar1 = true, *local_20 == '\"')) {
          bVar1 = bVar2;
        }
        if (!bVar1) break;
        bVar1 = !bVar2;
        bVar2 = false;
        if (bVar1) {
          bVar2 = *local_20 == '\\';
        }
      }
      if (*local_20 == '\0') {
        return false;
      }
    }
  }
  SVar3 = toSpan<char>((char *)*in_RDI,(long)local_20 - *in_RDI);
  local_38 = SVar3.first;
  *in_RSI = local_38;
  local_30 = SVar3.size;
  in_RSI[1] = local_30;
  *in_RDI = (long)local_20;
  return in_RSI[1] != 0;
}

Assistant:

bool matchAtomArg(const char*& input, StringSpan& arg) {
	const char* scan = input;
	for (int p = 0; *scan; ++scan) {
		if      (*scan == '(') { ++p; }
		else if (*scan == ')') { if (--p < 0) { break; } }
		else if (*scan == ',') { if (p == 0) { break; } }
		else if (*scan == '"') {
			bool quoted = false;
			for (++scan; *scan && (*scan != '\"' || quoted); ++scan) {
				quoted = !quoted && *scan == '\\';
			}
			if (!*scan) { return false; }
		}
	}
	arg = toSpan(input, static_cast<std::size_t>(scan - input));
	input = scan;
	return arg.size != 0;
}